

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cpp
# Opt level: O0

Transform * __thiscall pbrt::Transform::operator*(Transform *this,Transform *t2)

{
  Transform *in_RDI;
  Transform *m;
  Transform *in_stack_ffffffffffffff70;
  SquareMatrix<4> *in_stack_ffffffffffffffd8;
  SquareMatrix<4> *in_stack_ffffffffffffffe0;
  
  m = in_RDI;
  pbrt::operator*(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  pbrt::operator*(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  Transform(in_stack_ffffffffffffff70,&m->m,&in_RDI->m);
  return m;
}

Assistant:

Transform Transform::operator*(const Transform &t2) const {
    return Transform(m * t2.m, t2.mInv * mInv);
}